

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int side3_6d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  int local_290;
  int int_tmp_result_FFWKCAA;
  int r_sign;
  double max7;
  double max6;
  double max5;
  double max4;
  int int_tmp_result;
  int Delta_sign;
  double upper_bound_1;
  double lower_bound_1;
  double max3;
  double max2;
  double max1;
  double eps;
  double r;
  double DeltaLambda2;
  double DeltaLambda1;
  double DeltaLambda0;
  double Delta;
  double b22;
  double b21;
  double b20;
  double b12;
  double b11;
  double b10;
  double b02;
  double b01;
  double b00;
  double a32;
  double a31;
  double a30;
  double a22;
  double a21;
  double a20;
  double a12;
  double q2_5_p0_5;
  double q2_4_p0_4;
  double q2_3_p0_3;
  double q2_2_p0_2;
  double q2_1_p0_1;
  double q2_0_p0_0;
  double a11;
  double q1_5_p0_5;
  double q1_4_p0_4;
  double q1_3_p0_3;
  double q1_2_p0_2;
  double q1_1_p0_1;
  double q1_0_p0_0;
  double a10;
  double q0_5_p0_5;
  double q0_4_p0_4;
  double q0_3_p0_3;
  double q0_2_p0_2;
  double q0_1_p0_1;
  double q0_0_p0_0;
  double l3;
  double p3_5_p0_5;
  double p3_4_p0_4;
  double p3_3_p0_3;
  double p3_2_p0_2;
  double p3_1_p0_1;
  double p3_0_p0_0;
  double l2;
  double p2_5_p0_5;
  double p2_4_p0_4;
  double p2_3_p0_3;
  double p2_2_p0_2;
  double p2_1_p0_1;
  double p2_0_p0_0;
  double l1;
  double p1_5_p0_5;
  double p1_4_p0_4;
  double p1_3_p0_3;
  double p1_2_p0_2;
  double p1_1_p0_1;
  double p1_0_p0_0;
  double *q1_local;
  double *q0_local;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = *p1 - *p0;
  dVar2 = p1[1] - p0[1];
  dVar3 = p1[2] - p0[2];
  dVar4 = p1[3] - p0[3];
  dVar5 = p1[4] - p0[4];
  dVar6 = p1[5] - p0[5];
  dVar7 = (dVar6 * dVar6 +
          dVar5 * dVar5 + dVar4 * dVar4 + dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) * 1.0;
  dVar8 = *p2 - *p0;
  dVar9 = p2[1] - p0[1];
  dVar10 = p2[2] - p0[2];
  dVar11 = p2[3] - p0[3];
  dVar12 = p2[4] - p0[4];
  dVar13 = p2[5] - p0[5];
  dVar14 = (dVar13 * dVar13 +
           dVar12 * dVar12 + dVar11 * dVar11 + dVar10 * dVar10 + dVar8 * dVar8 + dVar9 * dVar9) *
           1.0;
  dVar15 = *p3 - *p0;
  dVar16 = p3[1] - p0[1];
  dVar17 = p3[2] - p0[2];
  dVar18 = p3[3] - p0[3];
  dVar19 = p3[4] - p0[4];
  dVar20 = p3[5] - p0[5];
  dVar21 = *q0 - *p0;
  dVar22 = q0[1] - p0[1];
  dVar23 = q0[2] - p0[2];
  dVar24 = q0[3] - p0[3];
  dVar25 = q0[4] - p0[4];
  dVar26 = q0[5] - p0[5];
  dVar27 = (dVar6 * dVar26 +
           dVar5 * dVar25 + dVar4 * dVar24 + dVar3 * dVar23 + dVar1 * dVar21 + dVar2 * dVar22) * 2.0
  ;
  dVar28 = *q1 - *p0;
  dVar29 = q1[1] - p0[1];
  dVar30 = q1[2] - p0[2];
  dVar31 = q1[3] - p0[3];
  dVar32 = q1[4] - p0[4];
  dVar33 = q1[5] - p0[5];
  dVar34 = (dVar6 * dVar33 +
           dVar5 * dVar32 + dVar4 * dVar31 + dVar3 * dVar30 + dVar1 * dVar28 + dVar2 * dVar29) * 2.0
  ;
  dVar35 = *q2 - *p0;
  dVar36 = q2[1] - p0[1];
  dVar37 = q2[2] - p0[2];
  dVar38 = q2[3] - p0[3];
  dVar39 = q2[4] - p0[4];
  dVar40 = q2[5] - p0[5];
  dVar41 = (dVar6 * dVar40 +
           dVar5 * dVar39 + dVar4 * dVar38 + dVar3 * dVar37 + dVar1 * dVar35 + dVar2 * dVar36) * 2.0
  ;
  dVar42 = (dVar13 * dVar26 +
           dVar12 * dVar25 + dVar11 * dVar24 + dVar10 * dVar23 + dVar8 * dVar21 + dVar9 * dVar22) *
           2.0;
  dVar43 = (dVar13 * dVar33 +
           dVar12 * dVar32 + dVar11 * dVar31 + dVar10 * dVar30 + dVar8 * dVar28 + dVar9 * dVar29) *
           2.0;
  dVar44 = (dVar13 * dVar40 +
           dVar12 * dVar39 + dVar11 * dVar38 + dVar10 * dVar37 + dVar8 * dVar35 + dVar9 * dVar36) *
           2.0;
  dVar45 = dVar34 * dVar44 + -(dVar41 * dVar43);
  dVar46 = dVar41 * dVar42 + -(dVar27 * dVar44);
  dVar47 = dVar27 * dVar43 + -(dVar34 * dVar42);
  dVar48 = dVar45 + dVar46 + dVar47;
  dVar7 = dVar48 * (dVar20 * dVar20 +
                   dVar19 * dVar19 +
                   dVar18 * dVar18 + dVar17 * dVar17 + dVar15 * dVar15 + dVar16 * dVar16) * 1.0 +
          -((dVar20 * dVar40 +
            dVar19 * dVar39 + dVar18 * dVar38 + dVar17 * dVar37 + dVar15 * dVar35 + dVar16 * dVar36)
            * 2.0 * ((dVar42 - dVar43) * dVar7 + (dVar34 - dVar27) * dVar14 + dVar47) +
           (dVar20 * dVar26 +
           dVar19 * dVar25 + dVar18 * dVar24 + dVar17 * dVar23 + dVar15 * dVar21 + dVar16 * dVar22)
           * 2.0 * ((dVar43 - dVar44) * dVar7 + (dVar41 - dVar34) * dVar14 + dVar45) +
           (dVar20 * dVar33 +
           dVar19 * dVar32 + dVar18 * dVar31 + dVar17 * dVar30 + dVar15 * dVar28 + dVar16 * dVar29)
           * 2.0 * ((dVar44 - dVar42) * dVar7 + (dVar27 - dVar41) * dVar14 + dVar46));
  max2 = ABS(dVar1);
  if (max2 < ABS(dVar3)) {
    max2 = ABS(dVar3);
  }
  if (max2 < ABS(dVar2)) {
    max2 = ABS(dVar2);
  }
  if (max2 < ABS(dVar4)) {
    max2 = ABS(dVar4);
  }
  if (max2 < ABS(dVar5)) {
    max2 = ABS(dVar5);
  }
  if (max2 < ABS(dVar6)) {
    max2 = ABS(dVar6);
  }
  max3 = ABS(dVar8);
  if (max3 < ABS(dVar9)) {
    max3 = ABS(dVar9);
  }
  if (max3 < ABS(dVar10)) {
    max3 = ABS(dVar10);
  }
  if (max3 < ABS(dVar11)) {
    max3 = ABS(dVar11);
  }
  if (max3 < ABS(dVar12)) {
    max3 = ABS(dVar12);
  }
  if (max3 < ABS(dVar13)) {
    max3 = ABS(dVar13);
  }
  lower_bound_1 = ABS(dVar21);
  if (lower_bound_1 < ABS(dVar22)) {
    lower_bound_1 = ABS(dVar22);
  }
  if (lower_bound_1 < ABS(dVar23)) {
    lower_bound_1 = ABS(dVar23);
  }
  if (lower_bound_1 < ABS(dVar24)) {
    lower_bound_1 = ABS(dVar24);
  }
  if (lower_bound_1 < ABS(dVar25)) {
    lower_bound_1 = ABS(dVar25);
  }
  if (lower_bound_1 < ABS(dVar26)) {
    lower_bound_1 = ABS(dVar26);
  }
  if (lower_bound_1 < ABS(dVar28)) {
    lower_bound_1 = ABS(dVar28);
  }
  if (lower_bound_1 < ABS(dVar29)) {
    lower_bound_1 = ABS(dVar29);
  }
  if (lower_bound_1 < ABS(dVar30)) {
    lower_bound_1 = ABS(dVar30);
  }
  if (lower_bound_1 < ABS(dVar31)) {
    lower_bound_1 = ABS(dVar31);
  }
  if (lower_bound_1 < ABS(dVar32)) {
    lower_bound_1 = ABS(dVar32);
  }
  if (lower_bound_1 < ABS(dVar33)) {
    lower_bound_1 = ABS(dVar33);
  }
  if (lower_bound_1 < ABS(dVar35)) {
    lower_bound_1 = ABS(dVar35);
  }
  if (lower_bound_1 < ABS(dVar36)) {
    lower_bound_1 = ABS(dVar36);
  }
  if (lower_bound_1 < ABS(dVar37)) {
    lower_bound_1 = ABS(dVar37);
  }
  if (lower_bound_1 < ABS(dVar38)) {
    lower_bound_1 = ABS(dVar38);
  }
  if (lower_bound_1 < ABS(dVar39)) {
    lower_bound_1 = ABS(dVar39);
  }
  if (lower_bound_1 < ABS(dVar40)) {
    lower_bound_1 = ABS(dVar40);
  }
  upper_bound_1 = max2;
  _int_tmp_result = max2;
  if (max2 <= max3) {
    if (max2 < max3) {
      _int_tmp_result = max3;
    }
  }
  else {
    upper_bound_1 = max3;
  }
  if (upper_bound_1 <= lower_bound_1) {
    if (_int_tmp_result < lower_bound_1) {
      _int_tmp_result = lower_bound_1;
    }
  }
  else {
    upper_bound_1 = lower_bound_1;
  }
  if (1.4995850219305951e-74 <= upper_bound_1) {
    if (_int_tmp_result <= 1.2980742146337065e+33) {
      dVar1 = max2 * lower_bound_1 * max3 * lower_bound_1 * 4.400074760265839e-13;
      if (dVar48 <= dVar1) {
        if (-dVar1 <= dVar48) {
          return 0;
        }
        max4._0_4_ = -1;
      }
      else {
        max4._0_4_ = 1;
      }
      max5 = max2;
      if (max2 < max3) {
        max5 = max3;
      }
      if (max5 < lower_bound_1) {
        max5 = lower_bound_1;
      }
      max6 = max2;
      if (max2 < ABS(dVar16)) {
        max6 = ABS(dVar16);
      }
      if (max6 < ABS(dVar17)) {
        max6 = ABS(dVar17);
      }
      if (max6 < ABS(dVar15)) {
        max6 = ABS(dVar15);
      }
      if (max6 < ABS(dVar18)) {
        max6 = ABS(dVar18);
      }
      if (max6 < ABS(dVar19)) {
        max6 = ABS(dVar19);
      }
      if (max6 < ABS(dVar20)) {
        max6 = ABS(dVar20);
      }
      if (max5 < max6) {
        max5 = max6;
      }
      max7 = max2;
      if (max2 < lower_bound_1) {
        max7 = lower_bound_1;
      }
      if (max7 < max6) {
        max7 = max6;
      }
      _int_tmp_result_FFWKCAA = max2;
      if (max2 < lower_bound_1) {
        _int_tmp_result_FFWKCAA = lower_bound_1;
      }
      if (max7 < _int_tmp_result_FFWKCAA) {
        max7 = _int_tmp_result_FFWKCAA;
      }
      if (max5 < max7) {
        max5 = max7;
      }
      if (max5 < _int_tmp_result_FFWKCAA) {
        max5 = _int_tmp_result_FFWKCAA;
      }
      upper_bound_1 = max3;
      _int_tmp_result = max3;
      if (lower_bound_1 < max3) {
        upper_bound_1 = lower_bound_1;
      }
      if (upper_bound_1 <= max5) {
        if (max3 < max5) {
          _int_tmp_result = max5;
        }
      }
      else {
        upper_bound_1 = max5;
      }
      if (max6 < upper_bound_1) {
        upper_bound_1 = max6;
      }
      if (max7 < upper_bound_1) {
        upper_bound_1 = max7;
      }
      if (_int_tmp_result_FFWKCAA < upper_bound_1) {
        upper_bound_1 = _int_tmp_result_FFWKCAA;
      }
      if (3.31864264949884e-50 <= upper_bound_1) {
        if (_int_tmp_result <= 1.2980742146337065e+33) {
          dVar1 = max6 * lower_bound_1 * max3 * _int_tmp_result_FFWKCAA * max7 * max5 *
                  1.665641335871132e-11;
          if (dVar7 <= dVar1) {
            if (-dVar1 <= dVar7) {
              return 0;
            }
            local_290 = -1;
          }
          else {
            local_290 = 1;
          }
          p0_local._4_4_ = max4._0_4_ * local_290;
        }
        else {
          p0_local._4_4_ = 0;
        }
      }
      else {
        p0_local._4_4_ = 0;
      }
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int side3_6d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double l1;
    l1 = (1 * ((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double l2;
    l2 = (1 * ((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double l3;
    l3 = (1 * ((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double a10;
    a10 = (2 * ((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double a11;
    a11 = (2 * ((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double a12;
    a12 = (2 * ((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)));
    double a20;
    a20 = (2 * ((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)));
    double a21;
    a21 = (2 * ((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)));
    double a22;
    a22 = (2 * ((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)));
    double a30;
    a30 = (2 * ((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)));
    double a31;
    a31 = (2 * ((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)));
    double a32;
    a32 = (2 * ((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_0_p0_0);
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    double max2 = fabs(p2_0_p0_0);
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_3_p0_3)) )
    {
        max2 = fabs(p2_3_p0_3);
    } 
    if( (max2 < fabs(p2_4_p0_4)) )
    {
        max2 = fabs(p2_4_p0_4);
    } 
    if( (max2 < fabs(p2_5_p0_5)) )
    {
        max2 = fabs(p2_5_p0_5);
    } 
    double max3 = fabs(q0_0_p0_0);
    if( (max3 < fabs(q0_1_p0_1)) )
    {
        max3 = fabs(q0_1_p0_1);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q0_4_p0_4)) )
    {
        max3 = fabs(q0_4_p0_4);
    } 
    if( (max3 < fabs(q0_5_p0_5)) )
    {
        max3 = fabs(q0_5_p0_5);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q1_4_p0_4)) )
    {
        max3 = fabs(q1_4_p0_4);
    } 
    if( (max3 < fabs(q1_5_p0_5)) )
    {
        max3 = fabs(q1_5_p0_5);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    if( (max3 < fabs(q2_4_p0_4)) )
    {
        max3 = fabs(q2_4_p0_4);
    } 
    if( (max3 < fabs(q2_5_p0_5)) )
    {
        max3 = fabs(q2_5_p0_5);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.49958502193059513986e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.40007476026583916019e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max1;
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max5 = max1;
    if( (max5 < fabs(p3_1_p0_1)) )
    {
        max5 = fabs(p3_1_p0_1);
    } 
    if( (max5 < fabs(p3_2_p0_2)) )
    {
        max5 = fabs(p3_2_p0_2);
    } 
    if( (max5 < fabs(p3_0_p0_0)) )
    {
        max5 = fabs(p3_0_p0_0);
    } 
    if( (max5 < fabs(p3_3_p0_3)) )
    {
        max5 = fabs(p3_3_p0_3);
    } 
    if( (max5 < fabs(p3_4_p0_4)) )
    {
        max5 = fabs(p3_4_p0_4);
    } 
    if( (max5 < fabs(p3_5_p0_5)) )
    {
        max5 = fabs(p3_5_p0_5);
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    double max6 = max1;
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max6 < max5) )
    {
        max6 = max5;
    } 
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    if( (max6 < max7) )
    {
        max6 = max7;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 3.31864264949884013629e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66564133587113197628e-11 * (((((max5 * max3) * max2) * max7) * max6) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}